

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-diag.c
# Opt level: O0

char * fy_error_type_str(fy_error_type type)

{
  char *pcStack_10;
  fy_error_type type_local;
  
  if (type < FYET_MAX) {
    pcStack_10 = fy_error_type_str::txt[type];
  }
  else {
    pcStack_10 = "*unknown*";
  }
  return pcStack_10;
}

Assistant:

static const char *fy_error_type_str(enum fy_error_type type) {
    static const char *txt[] = {
            [FYET_DEBUG]   = "debug",
            [FYET_INFO]    = "info",
            [FYET_NOTICE]  = "notice",
            [FYET_WARNING] = "warning",
            [FYET_ERROR]   = "error",
    };

    if ((unsigned int) type >= FYET_MAX)
        return "*unknown*";
    return txt[type];
}